

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void ClearReadRequests(SstStream Stream)

{
  long lVar1;
  void *pvVar2;
  long in_RDI;
  FFSArrayRequest_conflict PrevReq;
  FFSArrayRequest_conflict Req;
  FFSReaderMarshalBase *Info;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_RDI + 0x300);
  local_18 = *(void **)(lVar1 + 0x18);
  while (local_18 != (void *)0x0) {
    pvVar2 = *(void **)((long)local_18 + 0x30);
    free(*(void **)((long)local_18 + 0x20));
    free(*(void **)((long)local_18 + 0x18));
    free(local_18);
    local_18 = pvVar2;
  }
  *(undefined8 *)(lVar1 + 0x18) = 0;
  return;
}

Assistant:

static void ClearReadRequests(SstStream Stream)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    FFSArrayRequest Req = Info->PendingVarRequests;

    while (Req)
    {
        FFSArrayRequest PrevReq = Req;
        Req = Req->Next;
        free(PrevReq->Count);
        free(PrevReq->Start);
        free(PrevReq);
    }
    Info->PendingVarRequests = NULL;
}